

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pcMats)

{
  aiMaterial *this_00;
  size_t sVar1;
  aiMaterial *pcMatOut;
  aiString local_434;
  
  if (szCurrent == (uchar *)0x0) {
    __assert_fail("__null != szCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x328,
                  "void Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7(const unsigned char *, const unsigned char **, std::vector<aiMaterial *> &)"
                 );
  }
  if (szCurrentOut != (uchar **)0x0) {
    *szCurrentOut = szCurrent;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    pcMatOut = this_00;
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(pcMats,&pcMatOut);
    ParseSkinLump_3DGS_MDL7
              (this,szCurrent + 0x1c,szCurrentOut,pcMatOut,(uint)*szCurrent,*(uint *)(szCurrent + 4)
               ,*(uint *)(szCurrent + 8));
    if (szCurrent[0xc] != '\0') {
      local_434.length = 0;
      memset(local_434.data + 0x11,0x1b,0x3ef);
      local_434.data._0_8_ = *(undefined8 *)(szCurrent + 0xc);
      local_434.data._8_8_ = *(undefined8 *)(szCurrent + 0x14);
      local_434.data[0x10] = '\0';
      sVar1 = strlen(local_434.data);
      local_434.length = (ai_uint32)sVar1;
      aiMaterial::AddProperty(pcMatOut,&local_434,"?mat.name",0,0);
    }
    return;
  }
  __assert_fail("__null != szCurrentOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,0x329,
                "void Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7(const unsigned char *, const unsigned char **, std::vector<aiMaterial *> &)"
               );
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    std::vector<aiMaterial*>& pcMats)
{
    ai_assert(NULL != szCurrent);
    ai_assert(NULL != szCurrentOut);

    *szCurrentOut = szCurrent;
    BE_NCONST MDL::Skin_MDL7* pcSkin = (BE_NCONST MDL::Skin_MDL7*)szCurrent;
    AI_SWAP4(pcSkin->width);
    AI_SWAP4(pcSkin->height);
    szCurrent += 12;

    // allocate an output material
    aiMaterial* pcMatOut = new aiMaterial();
    pcMats.push_back(pcMatOut);

    // skip length of file name
    szCurrent += AI_MDL7_MAX_TEXNAMESIZE;

    ParseSkinLump_3DGS_MDL7(szCurrent,szCurrentOut,pcMatOut,
        pcSkin->typ,pcSkin->width,pcSkin->height);

    // place the name of the skin in the material
    if (pcSkin->texture_name[0])
    {
        // the 0 termination could be there or not - we can't know
        aiString szFile;
        ::memcpy(szFile.data,pcSkin->texture_name,sizeof(pcSkin->texture_name));
        szFile.data[sizeof(pcSkin->texture_name)] = '\0';
        szFile.length = ::strlen(szFile.data);

        pcMatOut->AddProperty(&szFile,AI_MATKEY_NAME);
    }
}